

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-engine.cpp
# Opt level: O0

void __thiscall
gepard::GepardEngine::setTransform
          (GepardEngine *this,Float a,Float b,Float c,Float d,Float e,Float f)

{
  GepardState *pGVar1;
  PathData *this_00;
  Transform local_a0;
  Transform local_70;
  Float local_40;
  Float f_local;
  Float e_local;
  Float d_local;
  Float c_local;
  Float b_local;
  Float a_local;
  GepardEngine *this_local;
  
  local_40 = f;
  f_local = e;
  e_local = d;
  d_local = c;
  c_local = b;
  b_local = a;
  a_local = (Float)this;
  Transform::Transform(&local_70,a,b,c,d,e,f);
  pGVar1 = state(this);
  memcpy(&pGVar1->transform,&local_70,0x30);
  this_00 = Path::pathData(&(this->_context).path);
  pGVar1 = state(this);
  Transform::inverse(&local_a0,&pGVar1->transform);
  PathData::applyTransform(this_00,&local_a0);
  return;
}

Assistant:

void GepardEngine::setTransform(Float a, Float b, Float c, Float d, Float e, Float f)
{
    state().transform = Transform(a, b, c, d, e, f);
    _context.path.pathData()->applyTransform(state().transform.inverse());
}